

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_part_file.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::posix_part_file::posix_part_file
          (posix_part_file *this,string *path,string *name,int num_pieces,int piece_size)

{
  uint uVar1;
  uint uVar2;
  strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void> idx;
  size_t sVar3;
  mapped_type *pmVar4;
  int *piVar5;
  reference rVar6;
  key_type local_9c;
  file_pointer f;
  error_code ec;
  vector<char,_std::allocator<char>_> header;
  char *ptr;
  vector<bool,_slot_index_t> free_slots;
  
  ::std::__cxx11::string::string((string *)this,(string *)path);
  ::std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  *(undefined8 *)
   ((long)&(this->m_free_slots).
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_free_slots).
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->m_free_slots).
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_free_slots).
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_max_pieces = num_pieces;
  this->m_piece_size = piece_size;
  this->m_header_size = num_pieces * 4 + 0x407U & 0xfffffc00;
  this->m_dirty_metadata = false;
  (this->m_piece_map)._M_h._M_buckets = &(this->m_piece_map)._M_h._M_single_bucket;
  (this->m_piece_map)._M_h._M_bucket_count = 1;
  (this->m_piece_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_piece_map)._M_h._M_element_count = 0;
  (this->m_piece_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_piece_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_piece_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  open_file((posix_part_file *)&f,(open_mode)this,(error_code *)0x0);
  ::std::vector<char,_std::allocator<char>_>::vector
            (&header,(long)this->m_header_size,(allocator_type *)&free_slots);
  sVar3 = fread(header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,1,
                (long)header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,(FILE *)f.ptr);
  if (sVar3 == (long)header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start) {
    if ((ulong)(long)this->m_header_size <= sVar3) {
      ptr = header.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start;
      uVar1 = read_impl<unsigned_int,char*>(&ptr);
      uVar2 = read_impl<unsigned_int,char*>(&ptr);
      if ((uVar1 == num_pieces) && (this->m_piece_size == uVar2)) {
        free_slots.super_vector<bool,_std::allocator<bool>_>.
        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        free_slots.super_vector<bool,_std::allocator<bool>_>.
        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_offset = 0;
        free_slots.super_vector<bool,_std::allocator<bool>_>.
        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
        super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        free_slots.super_vector<bool,_std::allocator<bool>_>.
        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
        super__Bit_iterator_base._M_offset = 0;
        free_slots.super_vector<bool,_std::allocator<bool>_>.
        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
        local_9c.m_val._0_1_ = 1;
        container_wrapper<bool,libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::vector<bool,std::allocator<bool>>>
        ::resize<int,void>((container_wrapper<bool,libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::vector<bool,std::allocator<bool>>>
                            *)&free_slots,num_pieces,(bool *)&local_9c);
        for (local_9c.m_val = 0; local_9c.m_val < num_pieces; local_9c.m_val = local_9c.m_val + 1) {
          idx.m_val = read_impl<int,char*>(&ptr);
          if (idx.m_val < num_pieces && -1 < idx.m_val) {
            if ((this->m_num_allocated).m_val <= idx.m_val) {
              (this->m_num_allocated).m_val = idx.m_val + 1;
            }
            rVar6 = container_wrapper<bool,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::vector<bool,_std::allocator<bool>_>_>
                    ::operator[](&free_slots,idx);
            *rVar6._M_p = *rVar6._M_p & ~rVar6._M_mask;
            pmVar4 = ::std::__detail::
                     _Map_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&this->m_piece_map,&local_9c);
            pmVar4->m_val = idx.m_val;
          }
        }
        for (local_9c.m_val = 0; local_9c.m_val < (this->m_num_allocated).m_val;
            local_9c.m_val = local_9c.m_val + 1) {
          rVar6 = container_wrapper<bool,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::vector<bool,_std::allocator<bool>_>_>
                  ::operator[](&free_slots,
                               (strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>)
                               local_9c.m_val);
          if ((*rVar6._M_p & rVar6._M_mask) != 0) {
            ::std::
            vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
            ::push_back(&this->m_free_slots,(value_type *)&local_9c);
          }
        }
        ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  ((_Bvector_base<std::allocator<bool>_> *)&free_slots);
      }
    }
  }
  else {
    piVar5 = __errno_location();
    boost::system::detail::failed_impl
              (*piVar5,&boost::system::detail::cat_holder<void>::generic_category_instance.
                        super_error_category);
  }
  ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&header.super__Vector_base<char,_std::allocator<char>_>);
  file_pointer::~file_pointer(&f);
  return;
}

Assistant:

posix_part_file::posix_part_file(std::string path, std::string name
		, int const num_pieces, int const piece_size)
		: m_path(std::move(path))
		, m_name(std::move(name))
		, m_max_pieces(num_pieces)
		, m_piece_size(piece_size)
		, m_header_size(round_up((2 + num_pieces) * 4))
	{
		TORRENT_ASSERT(num_pieces > 0);
		TORRENT_ASSERT(m_piece_size > 0);

		error_code ec;
		auto f = open_file(open_mode::read_only, ec);
		if (ec) return;

		// parse header
		std::vector<char> header(static_cast<std::size_t>(m_header_size));
		auto const n = std::fread(header.data(), 1, header.size(), f.file());
		if (std::size_t(n) != header.size())
		{
			ec.assign(errno, generic_category());
			return;
		}

		// we don't have a full header. consider the file empty
		if (n < std::size_t(m_header_size)) return;
		using namespace libtorrent::aux;

		char* ptr = header.data();
		// we have a header. Parse it
		int const num_pieces_ = int(read_uint32(ptr));
		int const piece_size_ = int(read_uint32(ptr));

		// if there is a mismatch in number of pieces or piece size
		// consider the file empty and overwrite anything in there
		if (num_pieces != num_pieces_ || m_piece_size != piece_size_) return;

		// this is used to determine which slots are free, and how many
		// slots are allocated
		aux::vector<bool, slot_index_t> free_slots;
		free_slots.resize(num_pieces, true);

		for (auto i = piece_index_t(0); i < piece_index_t(num_pieces); ++i)
		{
			slot_index_t const slot(read_int32(ptr));
			if (static_cast<int>(slot) < 0) continue;

			// invalid part-file
			TORRENT_ASSERT(slot < slot_index_t(num_pieces));
			if (slot >= slot_index_t(num_pieces)) continue;

			if (slot >= m_num_allocated)
				m_num_allocated = next(slot);

			free_slots[slot] = false;
			m_piece_map[i] = slot;
		}

		// now, populate the free_list with the "holes"
		for (slot_index_t i(0); i < m_num_allocated; ++i)
		{
			if (free_slots[i]) m_free_slots.push_back(i);
		}
	}